

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O2

void capnp::_::
     checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Data,_(capnp::Kind)1>,_false>
               (Builder reader,initializer_list<capnp::Data::Reader> expected)

{
  uchar *puVar1;
  size_t sVar2;
  uint index;
  ulong uVar3;
  Reader b;
  Reader a;
  Fault f;
  ListElementCount local_64;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  ulong local_38;
  
  local_38 = expected._M_len;
  _kjCondition.right = reader.builder.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = reader.builder.elementCount == local_38;
  _kjCondition.left = local_38;
  if (_kjCondition.result) {
    for (index = 0; uVar3 = (ulong)index, uVar3 < local_38; index = index + 1) {
      puVar1 = expected._M_array[uVar3].super_ArrayPtr<const_unsigned_char>.ptr;
      sVar2 = expected._M_array[uVar3].super_ArrayPtr<const_unsigned_char>.size_;
      b.super_ArrayPtr<const_unsigned_char> =
           (ArrayPtr<const_unsigned_char>)
           List<capnp::Data,_(capnp::Kind)1>::Builder::operator[](&reader,index);
      a.super_ArrayPtr<const_unsigned_char>.size_ = sVar2;
      a.super_ArrayPtr<const_unsigned_char>.ptr = puVar1;
      checkElement<capnp::Data::Reader>(a,b);
    }
    return;
  }
  local_64 = reader.builder.elementCount;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())",
             "_kjCondition,expected.size(), reader.size()",&_kjCondition,&local_38,&local_64);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}